

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void aom_yv12_copy_v_c(YV12_BUFFER_CONFIG *src_bc,YV12_BUFFER_CONFIG *dst_bc,int use_crop)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint16_t *dst16;
  uint16_t *src16;
  uint8_t *dst;
  uint8_t *src;
  int height;
  int width;
  int row;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_18;
  
  if (in_EDX == 0) {
    iVar1 = *(int *)(in_RDI + 4);
    local_48 = *(int *)(in_RDI + 0xc);
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x14);
    local_48 = *(int *)(in_RDI + 0x1c);
  }
  local_28 = *(void **)(in_RDI + 0x38);
  local_30 = *(void **)(in_RSI + 0x38);
  if ((*(uint *)(in_RDI + 0xc0) & 8) == 0) {
    for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
      memcpy(local_30,local_28,(long)iVar1);
      local_28 = (void *)((long)local_28 + (long)*(int *)(in_RDI + 0x24));
      local_30 = (void *)((long)local_30 + (long)*(int *)(in_RSI + 0x24));
    }
  }
  else {
    local_38 = (void *)((long)local_28 << 1);
    local_40 = (void *)((long)local_30 << 1);
    for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
      memcpy(local_40,local_38,(long)iVar1 << 1);
      local_38 = (void *)((long)local_38 + (long)*(int *)(in_RDI + 0x24) * 2);
      local_40 = (void *)((long)local_40 + (long)*(int *)(in_RSI + 0x24) * 2);
    }
  }
  return;
}

Assistant:

void aom_yv12_copy_v_c(const YV12_BUFFER_CONFIG *src_bc,
                       YV12_BUFFER_CONFIG *dst_bc, int use_crop) {
  int row;
  int width = use_crop ? src_bc->uv_crop_width : src_bc->uv_width;
  int height = use_crop ? src_bc->uv_crop_height : src_bc->uv_height;
  const uint8_t *src = src_bc->v_buffer;
  uint8_t *dst = dst_bc->v_buffer;
#if CONFIG_AV1_HIGHBITDEPTH
  if (src_bc->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *src16 = CONVERT_TO_SHORTPTR(src);
    uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
    for (row = 0; row < height; ++row) {
      memcpy(dst16, src16, width * sizeof(uint16_t));
      src16 += src_bc->uv_stride;
      dst16 += dst_bc->uv_stride;
    }
    return;
  }
#endif
  for (row = 0; row < height; ++row) {
    memcpy(dst, src, width);
    src += src_bc->uv_stride;
    dst += dst_bc->uv_stride;
  }
}